

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>
     ::
     Combine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *source,
               ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *target,
               AggregateInputData *param_3)

{
  string_t new_value;
  string_t new_value_00;
  bool bVar1;
  string_t *in_RSI;
  byte *in_RDI;
  undefined8 unaff_retaddr;
  string_t *in_stack_ffffffffffffffc8;
  string_t *in_stack_ffffffffffffffd0;
  
  if (((*in_RDI & 1) != 0) &&
     (((undefined1  [16])((undefined1  [16])in_RSI->value & (undefined1  [16])0x1) ==
       (undefined1  [16])0x0 ||
      (bVar1 = LessThan::Operation<duckdb::string_t>
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), bVar1)))) {
    new_value.value.pointer.ptr = (char *)unaff_retaddr;
    new_value.value._0_8_ = in_RDI;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>(in_RSI,new_value);
    *(byte *)((long)&in_RSI->value + 1) = in_RDI[1] & 1;
    if ((undefined1  [16])((undefined1  [16])in_RSI->value & (undefined1  [16])0x100) ==
        (undefined1  [16])0x0) {
      new_value_00.value.pointer.ptr = (char *)unaff_retaddr;
      new_value_00.value._0_8_ = in_RDI;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>(in_RSI,new_value_00);
    }
    *(undefined1 *)&in_RSI->value = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			STATE::template AssignValue<typename STATE::BY_TYPE>(target.value, source.value);
			target.arg_null = source.arg_null;
			if (!target.arg_null) {
				STATE::template AssignValue<typename STATE::ARG_TYPE>(target.arg, source.arg);
			}
			target.is_initialized = true;
		}
	}